

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

byte * __thiscall nuraft::buffer::get_raw(buffer *this,size_t len)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  overflow_error *this_00;
  uint uVar4;
  
  uVar1 = *(uint *)this;
  if ((int)uVar1 < 0) {
    uVar3 = uVar1 & 0x7fffffff;
  }
  else {
    uVar3 = (uint)*(ushort *)this;
  }
  if ((int)uVar1 < 0) {
    uVar4 = *(uint *)(this + 4);
  }
  else {
    uVar4 = (uint)*(ushort *)(this + 2);
  }
  if ((ulong)uVar3 - (ulong)uVar4 < len) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error
              (this_00,"insufficient buffer available for a raw byte array");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  if ((int)uVar1 < 0) {
    lVar2 = (ulong)*(uint *)(this + 4) + 8;
    *(int *)(this + 4) = *(int *)(this + 4) + (int)len;
  }
  else {
    lVar2 = (ulong)*(ushort *)(this + 2) + 4;
    *(short *)(this + 2) = *(short *)(this + 2) + (short)len;
  }
  return (byte *)(this + lVar2);
}

Assistant:

size_t buffer::size() const {
    return (size_t)( __size_of_block(this) );
}